

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_sdl.cpp
# Opt level: O1

void ImGui_ImplSDL2_SaveState(int id)

{
  mapped_type *pmVar1;
  long lVar2;
  SDL_Cursor **ppSVar3;
  SDL_Cursor **ppSVar4;
  byte bVar5;
  key_type local_4;
  
  bVar5 = 0;
  pmVar1 = std::map<int,_State,_std::less<int>,_std::allocator<std::pair<const_int,_State>_>_>::
           operator[](&g_state,&local_4);
  pmVar1->Window = g_Window;
  pmVar1->Time = g_Time;
  pmVar1->MousePressed[0] = (bool)_ZL14g_MousePressed_0;
  pmVar1->MousePressed[1] = (bool)_ZL14g_MousePressed_1;
  pmVar1->MousePressed[2] = (bool)_ZL14g_MousePressed_2;
  ppSVar3 = g_MouseCursors;
  ppSVar4 = pmVar1->MouseCursors;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    *ppSVar4 = *ppSVar3;
    ppSVar3 = ppSVar3 + (ulong)bVar5 * -2 + 1;
    ppSVar4 = ppSVar4 + (ulong)bVar5 * -2 + 1;
  }
  pmVar1->ClipboardTextData = g_ClipboardTextData;
  pmVar1->MouseCanUseGlobalState = g_MouseCanUseGlobalState;
  return;
}

Assistant:

void ImGui_ImplSDL2_SaveState(int id) {
    auto & dst = g_state[id];

    dst.Window                          = g_Window;
    dst.Time                            = g_Time;
    dst.MousePressed[0]                 = g_MousePressed[0];
    dst.MousePressed[1]                 = g_MousePressed[1];
    dst.MousePressed[2]                 = g_MousePressed[2];
    for (int i = 0; i < ImGuiMouseCursor_COUNT; ++i) {
        dst.MouseCursors[i]                 = g_MouseCursors[i];
    }
    dst.ClipboardTextData               = g_ClipboardTextData;
    dst.MouseCanUseGlobalState          = g_MouseCanUseGlobalState;
}